

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindow * ImGui::GetTopMostAndVisiblePopupModal(void)

{
  ImGuiWindow *pIVar1;
  long lVar2;
  ulong uVar3;
  ImGuiWindow **ppIVar4;
  
  lVar2 = (long)(GImGui->OpenPopupStack).Size;
  if (0 < lVar2) {
    uVar3 = lVar2 + 1;
    ppIVar4 = &(GImGui->OpenPopupStack).Data[lVar2 + -1].Window;
    do {
      pIVar1 = *ppIVar4;
      if ((((pIVar1 != (ImGuiWindow *)0x0) && ((pIVar1->Flags & 0x8000000) != 0)) &&
          (pIVar1->Active == true)) && (pIVar1->Hidden != true)) {
        return pIVar1;
      }
      uVar3 = uVar3 - 1;
      ppIVar4 = ppIVar4 + -6;
    } while (1 < uVar3);
  }
  return (ImGuiWindow *)0x0;
}

Assistant:

ImGuiWindow* ImGui::GetTopMostAndVisiblePopupModal()
{
    ImGuiContext& g = *GImGui;
    for (int n = g.OpenPopupStack.Size - 1; n >= 0; n--)
        if (ImGuiWindow* popup = g.OpenPopupStack.Data[n].Window)
            if ((popup->Flags & ImGuiWindowFlags_Modal) && IsWindowActiveAndVisible(popup))
                return popup;
    return NULL;
}